

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

bool __thiscall
LoopCrosser::CellCrossesCell(LoopCrosser *this,S2ClippedShape *a_clipped,S2ClippedShape *b_clipped)

{
  ulong uVar1;
  bool bVar2;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(*(uint *)&a_clipped->field_0x4 >> 1);
  lVar5 = 0;
  uVar1 = 0;
  do {
    uVar4 = uVar1;
    if (uVar6 == uVar4) break;
    paVar3 = &a_clipped->field_3;
    if (5 < *(uint *)&a_clipped->field_0x4) {
      paVar3 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(a_clipped->field_3).edges_;
    }
    StartEdge(this,*(int *)((long)paVar3 + lVar5));
    bVar2 = EdgeCrossesCell(this,b_clipped);
    lVar5 = lVar5 + 4;
    uVar1 = uVar4 + 1;
  } while (!bVar2);
  return uVar4 < uVar6;
}

Assistant:

bool LoopCrosser::CellCrossesCell(const S2ClippedShape& a_clipped,
                                  const S2ClippedShape& b_clipped) {
  // Test all edges of "a_clipped" against all edges of "b_clipped".
  int a_num_edges = a_clipped.num_edges();
  for (int i = 0; i < a_num_edges; ++i) {
    StartEdge(a_clipped.edge(i));
    if (EdgeCrossesCell(b_clipped)) return true;
  }
  return false;
}